

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::TagAliasRegistry::add
          (TagAliasRegistry *this,string *alias,string *tag,SourceLineInfo *lineInfo)

{
  ulong uVar1;
  int iVar2;
  undefined4 extraout_var;
  bool bVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>,_bool>
  pVar4;
  TagAlias local_b0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>
  local_80;
  
  local_80.first._M_dataplus._M_p = (pointer)&local_80.first.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"[@","");
  uVar1 = alias->_M_string_length;
  if (uVar1 < local_80.first._M_string_length) {
LAB_0017175a:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.first._M_dataplus._M_p != &local_80.first.field_2) {
      operator_delete(local_80.first._M_dataplus._M_p,
                      local_80.first.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (local_80.first._M_string_length != 0) {
      iVar2 = bcmp(local_80.first._M_dataplus._M_p,(alias->_M_dataplus)._M_p,
                   local_80.first._M_string_length);
      if (iVar2 != 0) goto LAB_0017175a;
    }
    if (uVar1 == 0) {
      bVar3 = true;
    }
    else {
      bVar3 = (alias->_M_dataplus)._M_p[uVar1 - 1] != ']';
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.first._M_dataplus._M_p != &local_80.first.field_2) {
      operator_delete(local_80.first._M_dataplus._M_p,
                      local_80.first.field_2._M_allocated_capacity + 1);
    }
    if (!bVar3) {
      TagAlias::TagAlias(&local_b0,tag,*lineInfo);
      clara::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>
      ::pair<Catch::TagAlias,_true>(&local_80,alias,&local_b0);
      pVar4 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagAlias>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagAlias>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagAlias>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,Catch::TagAlias>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagAlias>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagAlias>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagAlias>>>
                          *)&this->m_registry,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.second.tag._M_dataplus._M_p != &local_80.second.tag.field_2) {
        operator_delete(local_80.second.tag._M_dataplus._M_p,
                        local_80.second.tag.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.first._M_dataplus._M_p != &local_80.first.field_2) {
        operator_delete(local_80.first._M_dataplus._M_p,
                        local_80.first.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.tag._M_dataplus._M_p != &local_b0.tag.field_2) {
        operator_delete(local_b0.tag._M_dataplus._M_p,
                        (ulong)(local_b0.tag.field_2._M_allocated_capacity + 1));
      }
      if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        return;
      }
      ReusableStringStream::ReusableStringStream((ReusableStringStream *)&local_b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_b0.tag.field_2._M_allocated_capacity,"error: tag alias, \'",0x13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_b0.tag.field_2._M_allocated_capacity,(alias->_M_dataplus)._M_p,
                 alias->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_b0.tag.field_2._M_allocated_capacity,"\' already registered.\n",
                 0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_b0.tag.field_2._M_allocated_capacity,"\tFirst seen at: ",0x10);
      iVar2 = (*(this->super_ITagAliasRegistry)._vptr_ITagAliasRegistry[2])(this,alias);
      operator<<((ostream *)local_b0.tag.field_2._M_allocated_capacity,
                 (SourceLineInfo *)(CONCAT44(extraout_var,iVar2) + 0x20));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_b0.tag.field_2._M_allocated_capacity,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_b0.tag.field_2._M_allocated_capacity,"\tRedefined at: ",0xf);
      operator<<((ostream *)local_b0.tag.field_2._M_allocated_capacity,lineInfo);
      std::__cxx11::stringbuf::str();
      throw_domain_error(&local_80.first);
    }
  }
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)&local_b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_b0.tag.field_2._M_allocated_capacity,"error: tag alias, \'",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_b0.tag.field_2._M_allocated_capacity,(alias->_M_dataplus)._M_p,
             alias->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_b0.tag.field_2._M_allocated_capacity,
             "\' is not of the form [@alias name].\n",0x24);
  operator<<((ostream *)local_b0.tag.field_2._M_allocated_capacity,lineInfo);
  std::__cxx11::stringbuf::str();
  throw_domain_error(&local_80.first);
}

Assistant:

void TagAliasRegistry::add( std::string const& alias, std::string const& tag, SourceLineInfo const& lineInfo ) {
        CATCH_ENFORCE( startsWith(alias, "[@") && endsWith(alias, ']'),
                      "error: tag alias, '" << alias << "' is not of the form [@alias name].\n" << lineInfo );

        CATCH_ENFORCE( m_registry.insert(std::make_pair(alias, TagAlias(tag, lineInfo))).second,
                      "error: tag alias, '" << alias << "' already registered.\n"
                      << "\tFirst seen at: " << find(alias)->lineInfo << "\n"
                      << "\tRedefined at: " << lineInfo );
    }